

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

_Bool mips_cpu_has_work(CPUState *cs)

{
  _Bool _Var1;
  int iVar2;
  CPUMIPSState_conflict8 *env_00;
  _Bool local_21;
  _Bool has_work;
  CPUMIPSState_conflict8 *env;
  MIPSCPU_conflict5 *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUMIPSState_conflict8 *)(cs[1].tb_jmp_cache + 0x143);
  local_21 = false;
  if ((((cs->interrupt_request & 2) != 0) && (_Var1 = cpu_mips_hw_interrupts_pending(env_00), _Var1)
      ) && ((_Var1 = cpu_mips_hw_interrupts_enabled(env_00), _Var1 ||
            (((ulong)cs[1].tb_jmp_cache[0x910] & 0x2000) != 0)))) {
    local_21 = true;
  }
  if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x10ec) & 4) != 0) {
    if ((cs->interrupt_request & 0x100) != 0) {
      local_21 = true;
    }
    iVar2 = mips_vpe_active(env_00);
    if (iVar2 == 0) {
      local_21 = false;
    }
  }
  if (((ulong)cs[1].tb_jmp_cache[0x21f] & 0x80) != 0) {
    if ((cs->interrupt_request & 0x100) != 0) {
      local_21 = true;
    }
    iVar2 = mips_vp_active(env_00,cs);
    if (iVar2 == 0) {
      local_21 = false;
    }
  }
  return local_21;
}

Assistant:

static bool mips_cpu_has_work(CPUState *cs)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    bool has_work = false;

    /*
     * Prior to MIPS Release 6 it is implementation dependent if non-enabled
     * interrupts wake-up the CPU, however most of the implementations only
     * check for interrupts that can be taken.
     */
    if ((cs->interrupt_request & CPU_INTERRUPT_HARD) &&
        cpu_mips_hw_interrupts_pending(env)) {
        if (cpu_mips_hw_interrupts_enabled(env) ||
            (env->insn_flags & ISA_MIPS32R6)) {
            has_work = true;
        }
    }

    /* MIPS-MT has the ability to halt the CPU.  */
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        /*
         * The QEMU model will issue an _WAKE request whenever the CPUs
         * should be woken up.
         */
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }

        if (!mips_vpe_active(env)) {
            has_work = false;
        }
    }

    /* MIPS Release 6 has the ability to halt the CPU.  */
    if (env->CP0_Config5 & (1 << CP0C5_VP)) {
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }
        if (!mips_vp_active(env, cs)) {
            has_work = false;
        }
    }

    return has_work;
}